

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O1

sexp sexp_compile_op(sexp ctx,sexp self,sexp_sint_t n,sexp obj,sexp env)

{
  sexp psVar1;
  sexp_conflict extraout_RDX;
  sexp_conflict n_00;
  sexp_conflict extraout_RDX_00;
  sexp ast;
  sexp tmp;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp_gc_var_t __sexp_gc_preserver3;
  sexp_gc_var_t __sexp_gc_preserver2;
  sexp local_70;
  sexp_conflict local_68;
  sexp_conflict local_60;
  sexp_gc_var_t local_58;
  sexp_gc_var_t local_48;
  sexp_gc_var_t local_38;
  
  local_68 = (sexp_conflict)0x43e;
  local_58.var = (sexp_conflict *)0x0;
  local_58.next = (sexp_gc_var_t *)0x0;
  local_60 = (sexp_conflict)0x43e;
  local_38.var = (sexp_conflict *)0x0;
  local_38.next = (sexp_gc_var_t *)0x0;
  local_70 = (sexp)0x43e;
  local_48.var = (sexp_conflict *)0x0;
  local_48.next = (sexp_gc_var_t *)0x0;
  if (env == (sexp)0x0) {
    env = (ctx->value).type.cpl;
  }
  if ((((ulong)env & 3) == 0) && (env->tag == 0x17)) {
    local_58.var = &local_68;
    local_38.next = &local_58;
    local_58.next = (ctx->value).context.saves;
    (ctx->value).context.saves = local_38.next;
    local_38.var = &local_60;
    local_48.next = &local_38;
    (ctx->value).context.saves = local_48.next;
    local_48.var = &local_70;
    (ctx->value).context.saves = &local_48;
    psVar1 = sexp_make_eval_context(ctx,(sexp)0x0,env,0,0);
    if ((((ulong)psVar1 & 3) != 0) || (psVar1->tag != 0x13)) {
      local_60 = (ctx->value).type.getters;
      (ctx->value).type.getters = psVar1;
      local_68 = analyze(psVar1,obj,0,1);
      if ((((ulong)local_68 & 3) != 0) || (local_70 = local_68, local_68->tag != 0x13)) {
        local_70 = (((psVar1->value).type.setters)->value).opcode.dl;
        n_00 = extraout_RDX;
        while (((((ulong)local_70 & 3) == 0 && (local_70->tag == 6)) &&
               ((((ulong)local_68 & 3) != 0 || (n_00 = local_68, local_68->tag != 0x13))))) {
          local_68 = sexp_apply1(psVar1,(((local_70->value).type.name)->value).type.cpl,local_68);
          local_70 = (local_70->value).type.cpl;
          n_00 = extraout_RDX_00;
        }
        if ((((ulong)local_68 & 3) == 0) && (local_68->tag == 0x13)) {
          local_70 = local_68;
        }
        else {
          local_70 = sexp_generate_op(psVar1,self,(sexp_sint_t)n_00,local_68,psVar1);
        }
      }
      (ctx->value).type.getters = local_60;
      (ctx->value).context.last_fp = (psVar1->value).context.last_fp;
      psVar1 = local_70;
    }
    local_70 = psVar1;
    (ctx->value).context.saves = local_58.next;
    return local_70;
  }
  psVar1 = sexp_type_exception(ctx,self,0x17,env);
  return psVar1;
}

Assistant:

sexp sexp_compile_op (sexp ctx, sexp self, sexp_sint_t n, sexp obj, sexp env) {
  sexp_gc_var3(ast, tmp, res);
  sexp ctx2;
  if (! env) env = sexp_context_env(ctx);
  sexp_assert_type(ctx, sexp_envp, SEXP_ENV, env);
  sexp_gc_preserve3(ctx, ast, tmp, res);
  ctx2 = sexp_make_eval_context(ctx, NULL, env, 0, 0);
  if (sexp_exceptionp(ctx2)) {
    res = ctx2;
  } else {
    tmp = sexp_context_child(ctx);
    sexp_context_child(ctx) = ctx2;
    ast = sexp_analyze(ctx2, obj);
    if (sexp_exceptionp(ast)) {
      res = ast;
    } else {
      res = sexp_global(ctx2, SEXP_G_OPTIMIZATIONS);
      for ( ; sexp_pairp(res) && !sexp_exceptionp(ast); res=sexp_cdr(res))
        ast = sexp_apply1(ctx2, sexp_cdar(res), ast);
      if (sexp_exceptionp(ast)) {
        res = ast;
      } else {
        res = sexp_generate_op(ctx2, self, n, ast, ctx2);
      }
    }
    sexp_context_child(ctx) = tmp;
    sexp_context_last_fp(ctx) = sexp_context_last_fp(ctx2);
  }
  sexp_gc_release3(ctx);
  return res;
}